

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain.hpp
# Opt level: O2

demand_t * __thiscall so_5::mchain_props::demand_t::operator=(demand_t *this,demand_t *o)

{
  invocation_type_t iVar1;
  message_t *pmVar2;
  message_t *t;
  invocation_type_t __tmp;
  intrusive_ptr_t<so_5::message_t> local_18;
  invocation_type_t local_10;
  
  pmVar2 = (o->m_message_ref).m_obj;
  (o->m_message_ref).m_obj = (message_t *)0x0;
  iVar1 = o->m_demand_type;
  (this->m_msg_type)._M_target = (o->m_msg_type)._M_target;
  local_18.m_obj = (this->m_message_ref).m_obj;
  (this->m_message_ref).m_obj = pmVar2;
  local_10 = this->m_demand_type;
  this->m_demand_type = iVar1;
  intrusive_ptr_t<so_5::message_t>::dismiss_object(&local_18);
  return this;
}

Assistant:

demand_t &
		operator=( demand_t && o )
			{
				demand_t tmp{ std::move(o) };
				tmp.swap( *this );
				return *this;
			}